

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O2

void __thiscall
mp::
CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>
::CustomFunctionalConstraint
          (CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>
           *this,Arguments *args,Parameters prm)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  _Vector_base<int,_std::allocator<int>_> local_18;
  
  (this->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p =
       (pointer)&(this->super_FunctionalConstraint).super_BasicConstraint.name_.field_2;
  (this->super_FunctionalConstraint).super_BasicConstraint.name_._M_string_length = 0;
  (this->super_FunctionalConstraint).super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
  (this->super_FunctionalConstraint).result_var_ = -1;
  (this->super_FunctionalConstraint).ctx = CTX_NONE;
  piVar1 = (args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  piVar2 = (args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  (args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->
  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumberofConstId>
  ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       piVar2;
  (this->
  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumberofConstId>
  ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       piVar3;
  (this->
  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumberofConstId>
  ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = piVar1;
  local_18._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_18._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->
  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumberofConstId>
  ).params_._M_elems[0] = (double)prm._M_elems[0];
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_18);
  return;
}

Assistant:

CustomFunctionalConstraint(Arguments args, Parameters prm) noexcept :
    BaseType(std::move(args), std::move(prm)) { }